

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O3

void __thiscall
AddressFactory_GetAddressByLockingScript_Test::TestBody
          (AddressFactory_GetAddressByLockingScript_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pcVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Script script;
  AddressFactory factory;
  Address address;
  string local_3b8;
  AssertHelper local_398;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  undefined1 local_388 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [23];
  Script local_208;
  AddressFactory local_1d0;
  Address local_1a8;
  
  cfd::AddressFactory::AddressFactory(&local_1d0);
  cfd::core::Script::Script(&local_208);
  cfd::core::Address::Address(&local_1a8);
  paVar1 = &local_3b8.field_2;
  local_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b8,
             "210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac","");
  cfd::core::Script::Script((Script *)local_388,&local_3b8);
  cfd::core::Script::operator=(&local_208,(Script *)local_388);
  cfd::core::Script::~Script((Script *)local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_388,&local_1d0,&local_208);
      cfd::core::Address::operator=(&local_1a8,(Address *)local_388);
      cfd::core::Address::~Address((Address *)local_388);
    }
  }
  else {
    testing::Message::Message((Message *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x219,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  local_3b8._M_dataplus._M_p = (pointer)0x0;
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3b8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3b8._M_dataplus._M_p = pcVar3;
  if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3b8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a8.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3b8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_388,(ByteData *)&local_3b8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_398,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",
             (char *)CONCAT71(local_388._1_7_,local_388[0]),
             "49a011f97ba520dab063f309bad59daeb30de101");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    local_3b8.field_2._M_allocated_capacity - (long)local_3b8._M_dataplus._M_p);
  }
  if (local_398.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_390.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_390.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p._0_4_ = local_1a8.addr_type_;
  local_398.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_388,"address.GetAddressType()","AddressType::kP2pkhAddress",
             (AddressType *)&local_3b8,(AddressType *)&local_398);
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((long *)local_3b8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3b8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3b8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_388,&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3b8,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",(char *)CONCAT71(local_388._1_7_,local_388[0])
             ,"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((char)local_3b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_388);
    if ((pointer)local_3b8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b8,"76a91449a011f97ba520dab063f309bad59daeb30de10188ac","");
  cfd::core::Script::Script((Script *)local_388,&local_3b8);
  cfd::core::Script::operator=(&local_208,(Script *)local_388);
  cfd::core::Script::~Script((Script *)local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,(ulong)(local_3b8.field_2._M_allocated_capacity + 1))
    ;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_388,&local_1d0,&local_208);
      cfd::core::Address::operator=(&local_1a8,(Address *)local_388);
      cfd::core::Address::~Address((Address *)local_388);
    }
  }
  else {
    testing::Message::Message((Message *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21f,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  local_3b8._M_dataplus._M_p = (pointer)0x0;
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3b8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3b8._M_dataplus._M_p = pcVar3;
  if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3b8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a8.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3b8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_388,(ByteData *)&local_3b8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_398,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",
             (char *)CONCAT71(local_388._1_7_,local_388[0]),
             "49a011f97ba520dab063f309bad59daeb30de101");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    local_3b8.field_2._M_allocated_capacity - (long)local_3b8._M_dataplus._M_p);
  }
  if (local_398.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_390.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_390.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x220,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p._0_4_ = local_1a8.addr_type_;
  local_398.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_388,"address.GetAddressType()","AddressType::kP2pkhAddress",
             (AddressType *)&local_3b8,(AddressType *)&local_398);
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x221,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((long *)local_3b8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3b8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3b8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_388,&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3b8,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",(char *)CONCAT71(local_388._1_7_,local_388[0])
             ,"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((char)local_3b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_388);
    if ((pointer)local_3b8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x222,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b8,"a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487","");
  cfd::core::Script::Script((Script *)local_388,&local_3b8);
  cfd::core::Script::operator=(&local_208,(Script *)local_388);
  cfd::core::Script::~Script((Script *)local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,(ulong)(local_3b8.field_2._M_allocated_capacity + 1))
    ;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_388,&local_1d0,&local_208);
      cfd::core::Address::operator=(&local_1a8,(Address *)local_388);
      cfd::core::Address::~Address((Address *)local_388);
    }
  }
  else {
    testing::Message::Message((Message *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x225,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  local_3b8._M_dataplus._M_p = (pointer)0x0;
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3b8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3b8._M_dataplus._M_p = pcVar3;
  if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3b8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a8.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3b8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_388,(ByteData *)&local_3b8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_398,"address.GetHash().GetHex().c_str()",
             "\"f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4\"",
             (char *)CONCAT71(local_388._1_7_,local_388[0]),
             "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    local_3b8.field_2._M_allocated_capacity - (long)local_3b8._M_dataplus._M_p);
  }
  if (local_398.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_390.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_390.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x226,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p._0_4_ = local_1a8.addr_type_;
  local_398.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_388,"address.GetAddressType()","AddressType::kP2shAddress",
             (AddressType *)&local_3b8,(AddressType *)&local_398);
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x227,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((long *)local_3b8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3b8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3b8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_388,&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3b8,"address.GetAddress().c_str()",
             "\"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw\"",(char *)CONCAT71(local_388._1_7_,local_388[0])
             ,"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((char)local_3b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_388);
    if ((pointer)local_3b8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x228,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b8,"0014925d4028880bd0c9d68fbc7fc7dfee976698629c","");
  cfd::core::Script::Script((Script *)local_388,&local_3b8);
  cfd::core::Script::operator=(&local_208,(Script *)local_388);
  cfd::core::Script::~Script((Script *)local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,(ulong)(local_3b8.field_2._M_allocated_capacity + 1))
    ;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_388,&local_1d0,&local_208);
      cfd::core::Address::operator=(&local_1a8,(Address *)local_388);
      cfd::core::Address::~Address((Address *)local_388);
    }
  }
  else {
    testing::Message::Message((Message *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22b,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  local_3b8._M_dataplus._M_p = (pointer)0x0;
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3b8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3b8._M_dataplus._M_p = pcVar3;
  if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3b8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a8.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3b8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_388,(ByteData *)&local_3b8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_398,"address.GetHash().GetHex().c_str()",
             "\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             (char *)CONCAT71(local_388._1_7_,local_388[0]),
             "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    local_3b8.field_2._M_allocated_capacity - (long)local_3b8._M_dataplus._M_p);
  }
  if (local_398.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_390.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_390.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p._0_4_ = local_1a8.addr_type_;
  local_398.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_388,"address.GetAddressType()","AddressType::kP2wpkhAddress",
             (AddressType *)&local_3b8,(AddressType *)&local_398);
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((long *)local_3b8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3b8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3b8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_388,&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3b8,"address.GetAddress().c_str()",
             "\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",
             (char *)CONCAT71(local_388._1_7_,local_388[0]),
             "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((char)local_3b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_388);
    if ((pointer)local_3b8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b8,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437","");
  cfd::core::Script::Script((Script *)local_388,&local_3b8);
  cfd::core::Script::operator=(&local_208,(Script *)local_388);
  cfd::core::Script::~Script((Script *)local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,(ulong)(local_3b8.field_2._M_allocated_capacity + 1))
    ;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_388,&local_1d0,&local_208);
      cfd::core::Address::operator=(&local_1a8,(Address *)local_388);
      cfd::core::Address::~Address((Address *)local_388);
    }
  }
  else {
    testing::Message::Message((Message *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x231,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  local_3b8._M_dataplus._M_p = (pointer)0x0;
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3b8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3b8._M_dataplus._M_p = pcVar3;
  if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3b8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a8.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3b8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_388,(ByteData *)&local_3b8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_398,"address.GetHash().GetHex().c_str()",
             "\"87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437\"",
             (char *)CONCAT71(local_388._1_7_,local_388[0]),
             "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    local_3b8.field_2._M_allocated_capacity - (long)local_3b8._M_dataplus._M_p);
  }
  if (local_398.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_390.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_390.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x232,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p._0_4_ = local_1a8.addr_type_;
  local_398.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_388,"address.GetAddressType()","AddressType::kP2wshAddress",
             (AddressType *)&local_3b8,(AddressType *)&local_398);
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x233,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((long *)local_3b8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3b8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3b8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_388,&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3b8,"address.GetAddress().c_str()",
             "\"bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a\"",
             (char *)CONCAT71(local_388._1_7_,local_388[0]),
             "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((char)local_3b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_388);
    if ((pointer)local_3b8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x234,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b8,
             "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb","");
  cfd::core::Script::Script((Script *)local_388,&local_3b8);
  cfd::core::Script::operator=(&local_208,(Script *)local_388);
  cfd::core::Script::~Script((Script *)local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,(ulong)(local_3b8.field_2._M_allocated_capacity + 1))
    ;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_388,&local_1d0,&local_208);
      cfd::core::Address::operator=(&local_1a8,(Address *)local_388);
      cfd::core::Address::~Address((Address *)local_388);
    }
  }
  else {
    testing::Message::Message((Message *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x237,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  local_3b8._M_dataplus._M_p = (pointer)0x0;
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3b8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3b8._M_dataplus._M_p = pcVar3;
  if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3b8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a8.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3b8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_388,(ByteData *)&local_3b8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_398,"address.GetHash().GetHex().c_str()",
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             (char *)CONCAT71(local_388._1_7_,local_388[0]),
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    local_3b8.field_2._M_allocated_capacity - (long)local_3b8._M_dataplus._M_p);
  }
  if (local_398.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_390.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_390.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x238,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p._0_4_ = local_1a8.addr_type_;
  local_398.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_388,"address.GetAddressType()","AddressType::kTaprootAddress",
             (AddressType *)&local_3b8,(AddressType *)&local_398);
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x239,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((long *)local_3b8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3b8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3b8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_388,&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3b8,"address.GetAddress().c_str()",
             "\"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4\"",
             (char *)CONCAT71(local_388._1_7_,local_388[0]),
             "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((char)local_3b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_388);
    if ((pointer)local_3b8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b8,
             "512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799","");
  cfd::core::Script::Script((Script *)local_388,&local_3b8);
  cfd::core::Script::operator=(&local_208,(Script *)local_388);
  cfd::core::Script::~Script((Script *)local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,(ulong)(local_3b8.field_2._M_allocated_capacity + 1))
    ;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_388,&local_1d0,&local_208);
      cfd::core::Address::operator=(&local_1a8,(Address *)local_388);
      cfd::core::Address::~Address((Address *)local_388);
    }
  }
  else {
    testing::Message::Message((Message *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23d,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  local_3b8._M_dataplus._M_p = (pointer)0x0;
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3b8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3b8._M_dataplus._M_p = pcVar3;
  if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3b8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a8.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3b8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_388,(ByteData *)&local_3b8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_398,"address.GetHash().GetHex().c_str()",
             "\"88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799\"",
             (char *)CONCAT71(local_388._1_7_,local_388[0]),
             "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    local_3b8.field_2._M_allocated_capacity - (long)local_3b8._M_dataplus._M_p);
  }
  if (local_398.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if (local_390.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_390.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8._M_dataplus._M_p._0_4_ = local_1a8.addr_type_;
  local_398.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_388,"address.GetAddressType()","AddressType::kTaprootAddress",
             (AddressType *)&local_3b8,(AddressType *)&local_398);
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((long *)local_3b8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3b8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3b8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_388,&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3b8,"address.GetAddress().c_str()",
             "\"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah\"",
             (char *)CONCAT71(local_388._1_7_,local_388[0]),
             "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._1_7_,local_388[0]) != local_378) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_388._1_7_,local_388[0]),
                    (ulong)(local_378[0]._M_allocated_capacity + 1));
  }
  if ((char)local_3b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_388);
    if ((pointer)local_3b8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x240,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if (CONCAT71(local_388._1_7_,local_388[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_388._1_7_,local_388[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_388._1_7_,local_388[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::~Address(&local_1a8);
  cfd::core::Script::~Script(&local_208);
  local_1d0._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_0086bad8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_1d0.prefix_list_);
  return;
}

Assistant:

TEST(AddressFactory, GetAddressByLockingScript)
{
  AddressFactory factory;
  Script script;
  Address address;

  script = Script("210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("76a91449a011f97ba520dab063f309bad59daeb30de10188ac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2shAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");

  script = Script("0014925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");

  script = Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wshAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  
  script = Script("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  
  script = Script("512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
}